

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

reg_desc_t * find_rd_by_name(MIR_context_t ctx,char *name,MIR_func_t func)

{
  htab_size_t *phVar1;
  uint uVar2;
  MIR_module_t pMVar3;
  MIR_context_t item;
  long *plVar4;
  reg_desc_t *prVar5;
  int iVar6;
  htab_hash_t hVar7;
  MIR_alias_t MVar8;
  MIR_item_t_conflict pMVar9;
  HTAB_EL_size_t *pHVar10;
  c2mir_ctx *pcVar11;
  MIR_context_t string;
  char *pcVar12;
  ulong *puVar13;
  MIR_expr_data_t pMVar14;
  char *pcVar15;
  reg_desc_t *extraout_RAX;
  gen_ctx *in_RCX;
  gen_ctx *pgVar16;
  MIR_module_t pMVar17;
  DLIST_LINK_MIR_module_t *pDVar18;
  uint extraout_EDX;
  ulong uVar19;
  MIR_context_t ctx_00;
  char *unaff_RBX;
  uint *puVar20;
  uint *puVar21;
  FILE *pFVar22;
  FILE *pFVar23;
  FILE *pFVar24;
  void *unaff_RBP;
  ulong uVar25;
  uint uVar26;
  gen_ctx *pgVar27;
  MIR_context_t pMVar28;
  MIR_context_t ctx_01;
  htab_ind_t *phVar29;
  ulong uVar30;
  HTAB_EL_size_t *pHVar31;
  gen_ctx *pgVar32;
  undefined8 *puVar33;
  long lVar34;
  MIR_alias_t *pMVar35;
  gen_ctx *unaff_R13;
  gen_ctx *pgVar36;
  gen_ctx *unaff_R14;
  uint *puVar37;
  size_t *psVar38;
  gen_ctx *unaff_R15;
  MIR_str_t str;
  size_t rdn;
  MIR_context_t pMStack_1d0;
  undefined1 auStack_1c8 [32];
  MIR_context_t pMStack_1a8;
  undefined4 uStack_190;
  MIR_context_t *ppMStack_170;
  MIR_context_t apMStack_168 [17];
  io_ctx *piStack_e0;
  gen_ctx *pgStack_d8;
  gen_ctx *pgStack_d0;
  gen_ctx *pgStack_c8;
  gen_ctx *pgStack_c0;
  code *pcStack_b8;
  MIR_context_t pMStack_a8;
  gen_ctx *pgStack_a0;
  MIR_error_func_t p_Stack_98;
  uint uStack_90;
  uint uStack_8c;
  gen_ctx *pgStack_88;
  void *pvStack_80;
  htab_ind_t *phStack_78;
  ulong uStack_70;
  char *pcStack_68;
  gen_ctx *pgStack_60;
  gen_ctx *pgStack_58;
  gen_ctx *pgStack_50;
  gen_ctx *pgStack_48;
  size_t local_30;
  
  pgVar32 = *(gen_ctx **)name;
  pgVar16 = (gen_ctx *)name;
  pMVar28 = ctx;
  if (pgVar32 == (gen_ctx *)0x0) {
LAB_00138878:
    find_rd_by_name_cold_4();
  }
  else {
    pMVar9 = ((DLIST_MIR_item_t *)&pgVar32->curr_func_item)->head;
    if (pMVar9 != (MIR_item_t_conflict)0x0) {
      unaff_R15 = (gen_ctx *)pgVar32->ctx;
      pgVar16 = (gen_ctx *)((long)&unaff_R15->ctx + 1);
      pgVar27 = unaff_R15;
      if (*(gen_ctx **)&pgVar32->optimize_level < pgVar16) {
        unaff_R13 = (gen_ctx *)((long)pgVar16->call_used_hard_regs + (((ulong)pgVar16 >> 1) - 0x68))
        ;
        pMVar9 = (MIR_item_t_conflict)realloc(pMVar9,(long)unaff_R13 * 0x18);
        ((DLIST_MIR_item_t *)&pgVar32->curr_func_item)->head = pMVar9;
        *(gen_ctx **)&pgVar32->optimize_level = unaff_R13;
        pgVar16 = (gen_ctx *)((long)&((gen_ctx *)pgVar32->ctx)->ctx + 1);
        pgVar27 = (gen_ctx *)pgVar32->ctx;
      }
      pgVar32->ctx = (MIR_context_t)pgVar16;
      (&pMVar9->data)[(long)pgVar27 * 3] = (void *)0x6;
      (&pMVar9->module)[(long)pgVar27 * 3] = (MIR_module_t)ctx;
      pMVar28 = *(MIR_context_t *)(name + 8);
      pgVar16 = unaff_R15;
      iVar6 = HTAB_size_t_do((HTAB_size_t *)pMVar28,(size_t)unaff_R15,HTAB_FIND,&local_30);
      in_RCX = *(gen_ctx **)name;
      if (iVar6 == 0) {
        if (((in_RCX != (gen_ctx *)0x0) &&
            (((DLIST_MIR_item_t *)&in_RCX->curr_func_item)->head != (MIR_item_t_conflict)0x0)) &&
           (in_RCX->ctx != (MIR_context_t)0x0)) {
          in_RCX->ctx = (MIR_context_t)((long)&in_RCX->ctx[-1].wrapper_end_addr + 7);
          return (reg_desc_t *)0x0;
        }
      }
      else {
        if (((in_RCX != (gen_ctx *)0x0) &&
            (pMVar9 = ((DLIST_MIR_item_t *)&in_RCX->curr_func_item)->head,
            pMVar9 != (MIR_item_t_conflict)0x0)) && (in_RCX->ctx != (MIR_context_t)0x0)) {
          in_RCX->ctx = (MIR_context_t)((long)&in_RCX->ctx[-1].wrapper_end_addr + 7);
          return (reg_desc_t *)(&pMVar9->data + local_30 * 3);
        }
        find_rd_by_name_cold_1();
      }
      find_rd_by_name_cold_2();
      unaff_RBX = name;
      unaff_R14 = (gen_ctx *)ctx;
      goto LAB_00138878;
    }
  }
  find_rd_by_name_cold_3();
  pFVar23 = (FILE *)pMVar28->temp_data;
  pcStack_68 = unaff_RBX;
  pgStack_60 = pgVar32;
  pgStack_58 = unaff_R13;
  pgStack_50 = unaff_R14;
  pgStack_48 = unaff_R15;
  if (pFVar23 == (FILE *)0x0) {
    pcStack_b8 = (code *)0x138bd9;
    HTAB_size_t_do_cold_8();
    pgVar27 = pgVar16;
LAB_00138bd9:
    pcStack_b8 = (code *)0x138bde;
    HTAB_size_t_do_cold_7();
LAB_00138bde:
    pcStack_b8 = (code *)0x138be3;
    HTAB_size_t_do_cold_4();
LAB_00138be3:
    pcStack_b8 = (code *)0x138be8;
    HTAB_size_t_do_cold_3();
    pgVar36 = unaff_R13;
LAB_00138be8:
    pcStack_b8 = (code *)0x138bed;
    HTAB_size_t_do_cold_5();
    pFVar24 = pFVar23;
    pgVar16 = pgVar32;
    in_RCX = unaff_R15;
LAB_00138bed:
    pcStack_b8 = (code *)0x138bf2;
    HTAB_size_t_do_cold_6();
LAB_00138bf2:
    pcStack_b8 = (code *)0x138bf7;
    HTAB_size_t_do_cold_1();
  }
  else {
    pgVar27 = pgVar16;
    if ((VARR_HTAB_EL_size_t *)pMVar28->temp_string == (VARR_HTAB_EL_size_t *)0x0)
    goto LAB_00138bd9;
    unaff_RBP = (void *)(ulong)extraout_EDX;
    p_Stack_98 = pMVar28->error_func;
    pFVar22 = *(FILE **)&pFVar23->_flags;
    uStack_90 = extraout_EDX - 1;
    pgVar27 = (gen_ctx *)(ulong)uStack_90;
    pgVar36 = unaff_R13;
    pMStack_a8 = pMVar28;
    if (1 < uStack_90) {
LAB_00138901:
      pcStack_b8 = (code *)0x138911;
      hVar7 = (**(_func_htab_hash_t_size_t_void_ptr **)&pMStack_a8->func_redef_permission_p)
                        ((size_t)pgVar16,p_Stack_98);
      uVar26 = hVar7 + (hVar7 == 0);
      pgVar27 = (gen_ctx *)(ulong)uVar26;
      pFVar23 = pFVar22;
      pMVar28 = pMStack_a8;
      pgVar32 = pgVar16;
      unaff_R13 = pgVar36;
      unaff_R15 = in_RCX;
      if ((VARR_htab_ind_t *)pMStack_a8->temp_data == (VARR_htab_ind_t *)0x0) goto LAB_00138bde;
      pgStack_a0 = pgVar16;
      pvStack_80 = unaff_RBP;
      if ((VARR_HTAB_EL_size_t *)pMStack_a8->temp_string != (VARR_HTAB_EL_size_t *)0x0) {
        phVar29 = ((VARR_htab_ind_t *)pMStack_a8->temp_data)->varr;
        pHVar10 = ((VARR_HTAB_EL_size_t *)pMStack_a8->temp_string)->varr;
        uVar19 = (ulong)((int)pFVar22 - 1);
        uVar25 = (ulong)uVar26;
        puVar20 = (uint *)0x0;
        uStack_8c = uVar26;
        pgStack_88 = in_RCX;
        phStack_78 = phVar29;
        uStack_70 = uVar19;
        do {
          uVar26 = uVar26 & (uint)uVar19;
          puVar37 = phVar29 + uVar26;
          uVar30 = (ulong)*puVar37;
          puVar21 = puVar37;
          if (uVar30 != 0xfffffffe) {
            if (*puVar37 == 0xffffffff) {
              if (1 < uStack_90) {
                return (reg_desc_t *)0x0;
              }
              *(htab_size_t *)&pMVar28->gen_ctx = *(htab_size_t *)&pMVar28->gen_ctx + 1;
              uVar26 = *(uint *)&pMVar28->c2mir_ctx;
              if (puVar20 != (uint *)0x0) {
                puVar37 = puVar20;
              }
              pHVar10[uVar26].hash = (htab_hash_t)pgVar27;
              pHVar10[uVar26].el = (size_t)pgStack_a0;
              *(uint *)&pMVar28->c2mir_ctx = uVar26 + 1;
              *puVar37 = uVar26;
              pgStack_88->ctx = (MIR_context_t)pgStack_a0;
              return (reg_desc_t *)0x0;
            }
            puVar21 = puVar20;
            if (pHVar10[uVar30].hash == (htab_hash_t)pgVar27) {
              pHVar31 = pHVar10 + uVar30;
              pcStack_b8 = (code *)0x1389a7;
              iVar6 = (*(code *)pMStack_a8->insn_nops)(pHVar31->el,pgStack_a0,p_Stack_98);
              pgVar27 = (gen_ctx *)(ulong)uStack_8c;
              uVar19 = uStack_70;
              pMVar28 = pMStack_a8;
              phVar29 = phStack_78;
              if (iVar6 != 0) goto LAB_00138a21;
            }
          }
          phVar1 = (htab_size_t *)((long)&pMVar28->c2mir_ctx + 4);
          *phVar1 = *phVar1 + 1;
          uVar25 = uVar25 >> 0xb;
          uVar26 = (int)uVar25 + 1 + uVar26 * 5;
          puVar20 = puVar21;
        } while( true );
      }
      goto LAB_00138be3;
    }
    pgVar36 = (gen_ctx *)((VARR_HTAB_EL_size_t *)pMVar28->temp_string)->els_num;
    if (*(htab_size_t *)&pMVar28->c2mir_ctx != (htab_size_t)pgVar36) goto LAB_00138901;
    pMVar28 = (MIR_context_t)pFVar23->_IO_read_end;
    pFVar24 = pFVar23;
    if (pMVar28 == (MIR_context_t)0x0) goto LAB_00138bed;
    pgVar32 = (gen_ctx *)(ulong)((uint)pFVar22 * 2);
    if ((gen_ctx *)pFVar23->_IO_read_ptr != pgVar32) {
      pgVar27 = (gen_ctx *)((long)pgVar32 * 4);
      pcStack_b8 = (code *)0x138a78;
      pgStack_a0 = pgVar32;
      pHVar10 = (HTAB_EL_size_t *)realloc(pMVar28,(size_t)pgVar27);
      pFVar23->_IO_read_end = (char *)pHVar10;
      pFVar24 = (FILE *)pMStack_a8->temp_data;
      pFVar23->_IO_read_ptr = (char *)pgStack_a0;
      *(gen_ctx **)&pFVar23->_flags = pgStack_a0;
      unaff_R14 = pgStack_a0;
      pgVar32 = pgStack_a0;
      if (pFVar24 != (FILE *)0x0) goto LAB_00138aa0;
      goto LAB_00138bf2;
    }
    *(gen_ctx **)&pFVar23->_flags = pgVar32;
LAB_00138aa0:
    unaff_R14 = pgVar32;
    if ((int)unaff_R14 != 0) {
      pMVar28 = (MIR_context_t)((io_ctx *)pFVar24)->io_reader;
      pgVar27 = (gen_ctx *)0xff;
      pcStack_b8 = (code *)0x138abd;
      memset(pMVar28,0xff,(ulong)((uint)pFVar22 & 0x7fffffff) << 3);
    }
    pFVar23 = (FILE *)pMStack_a8->temp_string;
    pgVar32 = pgVar16;
    unaff_R15 = in_RCX;
    if ((pFVar23 == (FILE *)0x0) ||
       (pMVar28 = (MIR_context_t)pFVar23->_IO_read_end, pMVar28 == (MIR_context_t)0x0))
    goto LAB_00138be8;
    pgVar36 = (gen_ctx *)(ulong)((htab_size_t)pgVar36 * 2);
    if ((gen_ctx *)pFVar23->_IO_read_ptr == pgVar36) {
      *(gen_ctx **)&pFVar23->_flags = pgVar36;
      pFVar24 = pFVar23;
LAB_00138b1a:
      pHVar10 = (HTAB_EL_size_t *)pFVar24->_IO_read_end;
      uVar26 = *(htab_size_t *)((long)&pMStack_a8->gen_ctx + 4);
      uVar2 = *(uint *)&pMStack_a8->c2mir_ctx;
      *(htab_size_t *)&pMStack_a8->gen_ctx = 0;
      *(htab_size_t *)&pMStack_a8->c2mir_ctx = 0;
      *(htab_size_t *)((long)&pMStack_a8->gen_ctx + 4) = 0;
      if (uVar26 < uVar2) {
        iVar6 = uVar2 - uVar26;
        psVar38 = &pHVar10[uVar26].el;
        pMVar28 = pMStack_a8;
        do {
          if (((HTAB_EL_size_t *)(psVar38 + -1))->hash != 0) {
            pcStack_b8 = (code *)0x138b62;
            HTAB_size_t_do((HTAB_size_t *)pMVar28,*psVar38,HTAB_INSERT,(size_t *)in_RCX);
            pcStack_b8 = (code *)0x138b75;
            (*(code *)pMStack_a8->insn_nops)(in_RCX->ctx,*psVar38,p_Stack_98);
            pMVar28 = pMStack_a8;
          }
          psVar38 = psVar38 + 2;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
        pFVar22 = (FILE *)((ulong)unaff_R14 & 0xffffffff);
        pgVar36 = unaff_R14;
        unaff_R14 = (gen_ctx *)psVar38;
      }
      else {
        pFVar22 = (FILE *)((ulong)unaff_R14 & 0xffffffff);
      }
      goto LAB_00138901;
    }
    pgVar27 = (gen_ctx *)((long)pgVar36 << 4);
    pcStack_b8 = (code *)0x138afa;
    pHVar10 = (HTAB_EL_size_t *)realloc(pMVar28,(size_t)pgVar27);
    pFVar23->_IO_read_end = (char *)pHVar10;
    pFVar24 = (FILE *)pMStack_a8->temp_string;
    pFVar23->_IO_read_ptr = (char *)pgVar36;
    *(gen_ctx **)&pFVar23->_flags = pgVar36;
    if (pFVar24 != (FILE *)0x0) goto LAB_00138b1a;
  }
  pcStack_b8 = MIR_change_module_ctx;
  HTAB_size_t_do_cold_2();
  piStack_e0 = (io_ctx *)pFVar24;
  pgStack_d8 = pgVar16;
  pgStack_d0 = pgVar36;
  pgStack_c8 = unaff_R14;
  pgStack_c0 = in_RCX;
  pcStack_b8 = (code *)unaff_RBP;
  if (pgVar27 == (gen_ctx *)0x0) {
    MIR_change_module_ctx_cold_5();
LAB_00138f9b:
    MIR_change_module_ctx_cold_1();
LAB_00138fa0:
    MIR_change_module_ctx_cold_2();
    if (pMVar28 != (MIR_context_t)0x0) {
      switch(*(undefined4 *)&pMVar28->insn_nops) {
      case 0:
      case 1:
      case 5:
      case 6:
      case 7:
      case 8:
      case 9:
        pMVar28->used_label_p->els_num = (size_t)pgVar27;
        break;
      case 2:
      case 3:
      case 4:
        pMVar28->used_label_p = (VARR_uint8_t *)pgVar27;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0xaf1,"void set_item_name(MIR_item_t, const char *)");
      }
      return extraout_RAX;
    }
    __assert_fail("item != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0xae5,"void set_item_name(MIR_item_t, const char *)");
  }
  pMVar3 = ((DLIST_LINK_MIR_module_t *)&((MIR_context_t)pgVar27)->insn_nops)->prev;
  if (pMVar3 == (MIR_module_t)0x0) {
    if ((gen_ctx *)(pMVar28->all_modules).head != pgVar27) goto LAB_00138f9b;
    pMVar17 = (MIR_module_t)((MIR_context_t)pgVar27)->unspec_protos;
    (pMVar28->all_modules).head = pMVar17;
  }
  else {
    pMVar17 = (MIR_module_t)((MIR_context_t)pgVar27)->unspec_protos;
    (pMVar3->module_link).next = pMVar17;
  }
  if (pMVar17 == (MIR_module_t)0x0) {
    if ((gen_ctx *)(pMVar28->all_modules).tail != pgVar27) goto LAB_00138fa0;
    pDVar18 = (DLIST_LINK_MIR_module_t *)&(pMVar28->all_modules).tail;
  }
  else {
    pDVar18 = &pMVar17->module_link;
  }
  pDVar18->prev = pMVar3;
  ((DLIST_LINK_MIR_module_t *)&((MIR_context_t)pgVar27)->insn_nops)->prev = (MIR_module_t)0x0;
  ((MIR_context_t)pgVar27)->unspec_protos = (VARR_MIR_proto_t *)0x0;
  DLIST_MIR_module_t_append(&ctx_00->all_modules,(MIR_module_t_conflict)pgVar27);
  ctx_01 = ctx_00;
  pcVar11 = (c2mir_ctx *)get_ctx_str(ctx_00,(char *)((MIR_context_t)pgVar27)->c2mir_ctx);
  ((MIR_context_t)pgVar27)->c2mir_ctx = pcVar11;
  item = (MIR_context_t)((DLIST_MIR_item_t *)&((MIR_context_t)pgVar27)->error_func)->head;
  while( true ) {
    if (item == (MIR_context_t)0x0) {
      prVar5 = (reg_desc_t *)pMVar28->curr_label_num;
      if ((reg_desc_t *)ctx_00->curr_label_num < prVar5) {
        ctx_00->curr_label_num = (size_t)prVar5;
      }
      return prVar5;
    }
    if (item->temp_string != (VARR_char *)0x0) break;
    string = (MIR_context_t)MIR_item_name(ctx_01,(MIR_item_t_conflict)item);
    if (string != (MIR_context_t)0x0) {
      pcVar12 = get_ctx_str(ctx_00,(char *)string);
      ppMStack_170 = apMStack_168;
      uStack_190 = 0;
      pMStack_1a8 = (MIR_context_t)pgVar27;
      apMStack_168[0] = string;
      iVar6 = HTAB_MIR_item_t_do(pMVar28->module_item_tab,(MIR_item_t_conflict)(auStack_1c8 + 0x18),
                                 HTAB_FIND,(MIR_item_t_conflict *)&pMStack_1d0);
      if ((iVar6 == 0) || (pMStack_1d0 != item)) {
        ctx_01 = item;
        set_item_name((MIR_item_t_conflict)item,pcVar12);
      }
      else {
        apMStack_168[0] = item;
        HTAB_MIR_item_t_do(pMVar28->module_item_tab,(MIR_item_t_conflict)item,HTAB_DELETE,
                           (MIR_item_t_conflict *)apMStack_168);
        set_item_name((MIR_item_t_conflict)item,pcVar12);
        ctx_01 = (MIR_context_t)ctx_00->module_item_tab;
        HTAB_MIR_item_t_do((HTAB_MIR_item_t *)ctx_01,(MIR_item_t_conflict)item,HTAB_INSERT,
                           (MIR_item_t_conflict *)apMStack_168);
        if (item != apMStack_168[0]) goto LAB_00138f77;
      }
    }
    if (*(MIR_item_type_t *)&item->insn_nops == MIR_func_item) {
      plVar4 = (long *)((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->expr_data[5].name;
      puVar13 = (ulong *)*plVar4;
      if (puVar13 == (ulong *)0x0) goto LAB_00138f72;
      uVar25 = 0;
      puVar33 = (undefined8 *)(puVar13[2] + 0x28);
      while (uVar25 = uVar25 + 1, uVar25 < *puVar13) {
        pcVar12 = get_ctx_str(ctx_00,(char *)puVar33[-1]);
        puVar33[-1] = pcVar12;
        if ((char *)*puVar33 != (char *)0x0) {
          pcVar12 = get_ctx_str(ctx_00,(char *)*puVar33);
          *puVar33 = pcVar12;
        }
        puVar13 = (ulong *)*plVar4;
        puVar33 = puVar33 + 3;
        if (puVar13 == (ulong *)0x0) {
          MIR_change_module_ctx_cold_3();
          goto LAB_00138f61;
        }
      }
      ctx_01 = ctx_00;
      change_var_names(ctx_00,(VARR_MIR_var_t *)
                              ((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->expr_data[3].
                              load_addr);
      pMVar14 = ((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->expr_data;
      puVar13 = (ulong *)pMVar14[4].name;
      if ((puVar13 != (ulong *)0x0) && (*puVar13 != 0)) {
        lVar34 = 8;
        uVar25 = 0;
        do {
          uVar19 = puVar13[2];
          ctx_01 = ctx_00;
          pcVar12 = get_ctx_str(ctx_00,*(char **)(uVar19 + lVar34));
          *(char **)(uVar19 + lVar34) = pcVar12;
          uVar25 = uVar25 + 1;
          lVar34 = lVar34 + 0x18;
        } while (uVar25 < *puVar13);
        pMVar14 = ((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->expr_data;
      }
      for (pcVar12 = pMVar14[1].name; pcVar12 != (char *)0x0; pcVar12 = *(char **)(pcVar12 + 0x10))
      {
        if (*(int *)(pcVar12 + 0x1c) != 0) {
          pMVar35 = (MIR_alias_t *)(pcVar12 + 0x38);
          uVar25 = 0;
          do {
            if ((char)pMVar35[-4] == '\n') {
              if (pMVar35[-1] != 0) {
                pcVar15 = MIR_alias_name(pMVar28,pMVar35[-1]);
                ctx_01 = ctx_00;
                MVar8 = MIR_alias(ctx_00,pcVar15);
                pMVar35[-1] = MVar8;
              }
              if (*pMVar35 != 0) {
                pcVar15 = MIR_alias_name(pMVar28,*pMVar35);
                ctx_01 = ctx_00;
                MVar8 = MIR_alias(ctx_00,pcVar15);
                *pMVar35 = MVar8;
              }
            }
            else if ((char)pMVar35[-4] == '\t') {
              ctx_01 = (MIR_context_t)auStack_1c8;
              str.s = *(char **)pMVar35;
              str.len = *(size_t *)(pMVar35 + -2);
              string_store((string_t *)ctx_01,ctx_00,&ctx_00->string_ctx->strings,
                           &ctx_00->string_ctx->string_tab,str);
              *(undefined8 *)(pMVar35 + -2) = auStack_1c8._8_8_;
              *(undefined8 *)pMVar35 = auStack_1c8._16_8_;
            }
            uVar25 = uVar25 + 1;
            pMVar35 = pMVar35 + 0xc;
          } while (uVar25 < *(uint *)(pcVar12 + 0x1c));
        }
      }
    }
    else if (*(MIR_item_type_t *)&item->insn_nops == MIR_proto_item) {
      ctx_01 = ctx_00;
      change_var_names(ctx_00,(VARR_MIR_var_t *)
                              ((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->expr_data[1].
                              expr_item);
    }
    item = *(MIR_context_t *)&item->func_redef_permission_p;
  }
LAB_00138f61:
  (*pMVar28->error_func)(MIR_ctx_change_error,"Change context of a loaded module");
LAB_00138f72:
  MIR_change_module_ctx_cold_4();
LAB_00138f77:
  __assert_fail("item == tab_item",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0xb11,"void MIR_change_module_ctx(MIR_context_t, MIR_module_t, MIR_context_t)");
LAB_00138a21:
  if ((int)pvStack_80 == 2) {
    if (pMStack_a8->unspec_protos != (VARR_MIR_proto_t *)0x0) {
      pcStack_b8 = (code *)0x138ba7;
      (*(code *)pMStack_a8->unspec_protos)(pHVar31->el,p_Stack_98);
    }
    pHVar31->el = (size_t)pgStack_a0;
  }
  else {
    if ((int)pvStack_80 == 3) {
      *(htab_size_t *)&pMStack_a8->gen_ctx = *(htab_size_t *)&pMStack_a8->gen_ctx - 1;
      *puVar37 = 0xfffffffe;
      if (pMStack_a8->unspec_protos != (VARR_MIR_proto_t *)0x0) {
        pcStack_b8 = (code *)0x138a56;
        (*(code *)pMStack_a8->unspec_protos)(pHVar31->el,p_Stack_98);
      }
      pHVar31->hash = 0;
      goto LAB_00138bc0;
    }
    pgStack_a0 = (gen_ctx *)pHVar31->el;
  }
  pgStack_88->ctx = (MIR_context_t)pgStack_a0;
LAB_00138bc0:
  return (reg_desc_t *)&DAT_00000001;
}

Assistant:

static reg_desc_t *find_rd_by_name (MIR_context_t ctx MIR_UNUSED, const char *name,
                                    MIR_func_t func) {
  func_regs_t func_regs = func->internal;
  size_t rdn, temp_rdn;
  reg_desc_t rd;

  rd.name = (char *) name;
  rd.type = MIR_T_I64;
  rd.reg = 0; /* to eliminate warnings */
  temp_rdn = VARR_LENGTH (reg_desc_t, func_regs->reg_descs);
  VARR_PUSH (reg_desc_t, func_regs->reg_descs, rd);
  if (!HTAB_DO (size_t, func_regs->name2rdn_tab, temp_rdn, HTAB_FIND, rdn)) {
    VARR_POP (reg_desc_t, func_regs->reg_descs);
    return NULL; /* undeclared */
  }
  VARR_POP (reg_desc_t, func_regs->reg_descs);
  return &VARR_ADDR (reg_desc_t, func_regs->reg_descs)[rdn];
}